

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example9.cpp
# Opt level: O1

int main(void)

{
  double dVar1;
  Box *this;
  undefined8 *puVar2;
  BmpImage *this_00;
  Texture *m;
  Scene *this_01;
  PlaneMap *this_02;
  Vector local_98;
  Vector local_78;
  Vector local_60;
  Vector local_48;
  
  this = (Box *)operator_new(400);
  local_98.x = 0.0;
  local_98.y = -2.0;
  local_98.z = 5.0;
  local_78.x = 8.0;
  local_78.y = 0.0;
  local_78.z = 3.0;
  local_60.x = -8.0;
  local_60.y = 0.0;
  local_60.z = 3.0;
  local_48.x = 0.0;
  local_48.y = -3.0;
  local_48.z = 0.0;
  Box::Box(this,&local_98,&local_78,&local_60,&local_48);
  puVar2 = (undefined8 *)operator_new(0x40);
  puVar2[3] = 0x3ff0000000000000;
  puVar2[2] = 0x3ff0000000000000;
  puVar2[1] = 0x3ff0000000000000;
  *puVar2 = &PTR__LightSource_0010bc40;
  puVar2[4] = 0x401c000000000000;
  puVar2[5] = 0x4024000000000000;
  puVar2[6] = 0xc024000000000000;
  puVar2[7] = 0x4034000000000000;
  this_00 = (BmpImage *)operator_new(0x20);
  BmpImage::BmpImage(this_00,"backgnd.bmp");
  m = (Texture *)operator_new(0x68);
  m->next = (Texture *)0x0;
  m->object = (GeometricObject *)0x0;
  m->turb = 0.0;
  m->octaves = 6;
  (m->offs).x = 0.0;
  (m->offs).y = 0.0;
  (m->offs).z = 0.0;
  (m->scale).z = 1.0;
  (m->scale).y = 1.0;
  (m->scale).x = 1.0;
  m->_vptr_Texture = (_func_int **)&PTR__ColorMap_0010bc80;
  m[1]._vptr_Texture = (_func_int **)this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Image*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&m[1].next,(Image *)this_00);
  (m->scale).z = 25.0;
  (m->scale).y = 25.0;
  (m->scale).x = 25.0;
  this_01 = (Scene *)operator_new(0xe8);
  this_01->_vptr_Scene = (_func_int **)&PTR__Scene_0010ba58;
  (this_01->light).
  super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_01->light).
  super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_01->light).
  super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_01->solid).
  super__Vector_base<std::shared_ptr<GeometricObject>,_std::allocator<std::shared_ptr<GeometricObject>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_01->solid).
  super__Vector_base<std::shared_ptr<GeometricObject>,_std::allocator<std::shared_ptr<GeometricObject>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_01->solid).
  super__Vector_base<std::shared_ptr<GeometricObject>,_std::allocator<std::shared_ptr<GeometricObject>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_01->envFog).super___shared_ptr<Fog,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this_01->envFog).super___shared_ptr<Fog,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this_01->eye).x = 0.0;
  (this_01->eye).y = 0.0;
  (this_01->eye).z = 0.0;
  (this_01->eye_dir).x = 0.0;
  (this_01->eye_dir).y = 0.0;
  (this_01->eye_dir).z = 1.0;
  (this_01->view_x).x = 1.0;
  (this_01->view_x).y = 0.0;
  (this_01->view_x).z = 0.0;
  (this_01->view_y).x = 0.0;
  (this_01->view_y).y = 1.0;
  (this_01->view_y).z = 0.0;
  this_01->aperture = 0.0;
  this_01->focus = 0.0;
  (this_01->ambient).z = 1.0;
  (this_01->ambient).y = 1.0;
  (this_01->ambient).x = 1.0;
  (this_01->background).x = 0.0;
  (this_01->background).y = 0.05;
  (this_01->background).z = 0.05;
  this_02 = (PlaneMap *)operator_new(0x38);
  local_98.x = 0.0;
  local_98.y = -1.0;
  local_98.z = -1.0;
  local_78.x = 1.0;
  local_78.y = 0.0;
  local_78.z = 0.0;
  PlaneMap::PlaneMap(this_02,&local_98,&local_78);
  (this->super_GeometricObject).mapping = (Map *)this_02;
  GeometricObject::add((GeometricObject *)this,m);
  (this->super_GeometricObject).def_material.ka = 0.3;
  (this->super_GeometricObject).def_material.kd = 0.8;
  (this->super_GeometricObject).def_material.ks = 0.3;
  (this->super_GeometricObject).def_material.kr = 0.0;
  (this->super_GeometricObject).def_material.med.ior = 0.0;
  (this->super_GeometricObject).def_material.p = 5;
  dVar1 = Grayzer::Medium::glass.beta;
  (this->super_GeometricObject).def_material.med.ior = Grayzer::Medium::glass.ior;
  (this->super_GeometricObject).def_material.med.beta = dVar1;
  (this->super_GeometricObject).def_material.color.x = 1.0;
  (this->super_GeometricObject).def_material.color.y = 1.0;
  (this->super_GeometricObject).def_material.color.z = 1.0;
  local_98.x = (double)this;
  std::vector<std::shared_ptr<GeometricObject>,std::allocator<std::shared_ptr<GeometricObject>>>::
  emplace_back<GeometricObject*&>
            ((vector<std::shared_ptr<GeometricObject>,std::allocator<std::shared_ptr<GeometricObject>>>
              *)&this_01->solid,(GeometricObject **)&local_98);
  local_98.x = (double)puVar2;
  std::vector<std::shared_ptr<LightSource>,std::allocator<std::shared_ptr<LightSource>>>::
  emplace_back<LightSource*&>
            ((vector<std::shared_ptr<LightSource>,std::allocator<std::shared_ptr<LightSource>>> *)
             &this_01->light,(LightSource **)&local_98);
  (this_01->background).x = 0.196078;
  (this_01->background).y = 0.6;
  (this_01->background).z = 0.8;
  local_98.z = 0.0;
  local_98.x = 0.0;
  local_98.y = 0.0;
  local_78.x = 0.0;
  local_78.y = 0.0;
  local_78.z = 1.0;
  local_60.x = 0.0;
  local_60.y = 1.0;
  local_60.z = 0.0;
  Scene::setCamera(this_01,&local_98,&local_78,&local_60);
  render_scene(this_01,1.6,1.0,0x140,200,"SAMPLE90.TGA");
  return 0;
}

Assistant:

int main()
{
    Box *b = new Box(Vector(0,-2,5),Vector(8,0,3),Vector(-8,0,3),Vector(0,-3,0));
//  Sphere *s = new Sphere(Vector(0,0,5),50);
    LightSource *Light1 = new PointLight(Vector(7,10,-10),20);
    BmpImage *img = new BmpImage("backgnd.bmp");
    ColorMap *cmap = new ColorMap(img);

    cmap->scale = 25;

    Scene* scene = new Scene;

    b->mapping = new PlaneMap(Vector(0,-1,-1),Vector(1,0,0));
    b->add(cmap);
    b->ambient(0.3);
    b->diffuse(0.8);
    b->specular(0.3);
    b->reflection(0.0);
    b->ior(0.0);
    b->phong_size(5);
    b->medium(Grayzer::Medium::glass);
    b->color(1);

    scene->add(b);
    scene->add(Light1);

    scene->setBackground(SkyBlue);
    scene->setCamera(Vector(0),Vector(0,0,1),Vector(0,1,0));
    render_scene(scene, 1.6,1.0,320,200,"SAMPLE90.TGA");
}